

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

void flatbuffers::tests::anon_unknown_0::FixedLengthArrayJsonTest
               (string *tests_data_path,bool binary)

{
  char **ppcVar1;
  char **ppcVar2;
  FlatBufferBuilder *this;
  pointer pcVar3;
  bool bVar4;
  int expval;
  long *plVar5;
  uint8_t *puVar6;
  char *pcVar7;
  uint8_t *__s2;
  long *plVar8;
  string schemafile;
  string jsonGen;
  string jsonfile;
  Verifier verifierGen;
  Verifier verifierOrg;
  Parser parserOrg;
  Parser parserGen;
  string local_12e8;
  string local_12c8;
  string local_12a8;
  VerifierTemplate<false> local_1288;
  undefined1 local_1240 [24];
  undefined2 local_1228;
  size_type local_1220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1218;
  _Alloc_hider _Stack_1208;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_1200;
  Parser local_f30;
  Parser local_7b0;
  
  local_12e8._M_string_length = 0;
  local_12e8.field_2._M_local_buf[0] = '\0';
  local_12a8._M_string_length = 0;
  local_12a8.field_2._M_local_buf[0] = '\0';
  ppcVar1 = &local_7b0.super_ParserState.line_start_;
  pcVar3 = (tests_data_path->_M_dataplus)._M_p;
  local_12e8._M_dataplus._M_p = (pointer)&local_12e8.field_2;
  local_12a8._M_dataplus._M_p = (pointer)&local_12a8.field_2;
  local_7b0.super_ParserState.prev_cursor_ = (char *)ppcVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_7b0,pcVar3,pcVar3 + tests_data_path->_M_string_length);
  std::__cxx11::string::append((char *)&local_7b0);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_7b0);
  ppcVar2 = &local_f30.super_ParserState.line_start_;
  plVar8 = plVar5 + 2;
  if ((char **)*plVar5 == (char **)plVar8) {
    local_f30.super_ParserState.line_start_ = (char *)*plVar8;
    local_f30.super_ParserState._24_8_ = plVar5[3];
    local_f30.super_ParserState.prev_cursor_ = (char *)ppcVar2;
  }
  else {
    local_f30.super_ParserState.line_start_ = (char *)*plVar8;
    local_f30.super_ParserState.prev_cursor_ = (char *)*plVar5;
  }
  local_f30.super_ParserState.cursor_ = (char *)plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  bVar4 = LoadFile(local_f30.super_ParserState.prev_cursor_,binary,&local_12e8);
  TestEq<bool,bool>(bVar4,true,
                    "\'flatbuffers::LoadFile( (tests_data_path + \"arrays_test.\" + (binary ? \"bfbs\" : \"fbs\")) .c_str(), binary, &schemafile)\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test.cpp"
                    ,0x3a6,"");
  if ((char **)local_f30.super_ParserState.prev_cursor_ != ppcVar2) {
    operator_delete(local_f30.super_ParserState.prev_cursor_,
                    (ulong)(local_f30.super_ParserState.line_start_ + 1));
  }
  if ((char **)local_7b0.super_ParserState.prev_cursor_ != ppcVar1) {
    operator_delete(local_7b0.super_ParserState.prev_cursor_,
                    (ulong)(local_7b0.super_ParserState.line_start_ + 1));
  }
  pcVar3 = (tests_data_path->_M_dataplus)._M_p;
  local_f30.super_ParserState.prev_cursor_ = (char *)ppcVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f30,pcVar3,pcVar3 + tests_data_path->_M_string_length);
  std::__cxx11::string::append((char *)&local_f30);
  bVar4 = LoadFile(local_f30.super_ParserState.prev_cursor_,false,&local_12a8);
  TestEq<bool,bool>(bVar4,true,
                    "\'flatbuffers::LoadFile((tests_data_path + \"arrays_test.golden\").c_str(), false, &jsonfile)\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test.cpp"
                    ,0x3aa,"");
  if ((char **)local_f30.super_ParserState.prev_cursor_ != ppcVar2) {
    operator_delete(local_f30.super_ParserState.prev_cursor_,
                    (ulong)(local_f30.super_ParserState.line_start_ + 1));
  }
  IDLOptions::IDLOptions((IDLOptions *)&local_7b0);
  Parser::Parser(&local_f30,(IDLOptions *)&local_7b0);
  IDLOptions::~IDLOptions((IDLOptions *)&local_7b0);
  IDLOptions::IDLOptions((IDLOptions *)local_1240);
  Parser::Parser(&local_7b0,(IDLOptions *)local_1240);
  IDLOptions::~IDLOptions((IDLOptions *)local_1240);
  if (binary) {
    local_1240._0_8_ = local_12e8._M_dataplus._M_p;
    local_1240._8_8_ = local_12e8._M_string_length;
    local_1240._16_4_ = 0x40;
    local_1240._20_4_ = 1000000;
    local_1228._0_1_ = true;
    local_1228._1_1_ = true;
    local_1220 = 0x7fffffff;
    local_1218._M_local_buf[0] = '\0';
    local_1218._8_8_ = 0;
    _Stack_1208._M_p = (pointer)0x0;
    local_1200 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
    if (0x7ffffffe < local_12e8._M_string_length) goto LAB_0019a51a;
    bVar4 = VerifierTemplate<false>::VerifyBufferFromStart<reflection::Schema>
                      ((VerifierTemplate<false> *)local_1240,"BFBS",0);
    TestEq<bool,bool>(bVar4,true,"\'reflection::VerifySchemaBuffer(verifier)\' != \'true\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test.cpp"
                      ,0x3b2,"");
    bVar4 = Parser::Deserialize(&local_f30,(uint8_t *)local_12e8._M_dataplus._M_p,
                                local_12e8._M_string_length);
    TestEq<bool,bool>(bVar4,true,
                      "\'parserOrg.Deserialize( reinterpret_cast<const uint8_t *>(schemafile.c_str()), schemafile.size())\' != \'true\'"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test.cpp"
                      ,0x3b6,"");
    bVar4 = Parser::Deserialize(&local_7b0,(uint8_t *)local_12e8._M_dataplus._M_p,
                                local_12e8._M_string_length);
    TestEq<bool,bool>(bVar4,true,
                      "\'parserGen.Deserialize( reinterpret_cast<const uint8_t *>(schemafile.c_str()), schemafile.size())\' != \'true\'"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test.cpp"
                      ,0x3ba,"");
  }
  else {
    bVar4 = Parser::Parse(&local_f30,local_12e8._M_dataplus._M_p,(char **)0x0,(char *)0x0);
    TestEq<bool,bool>(bVar4,true,"\'parserOrg.Parse(schemafile.c_str())\' != \'true\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test.cpp"
                      ,0x3bc,"");
    bVar4 = Parser::Parse(&local_7b0,local_12e8._M_dataplus._M_p,(char **)0x0,(char *)0x0);
    TestEq<bool,bool>(bVar4,true,"\'parserGen.Parse(schemafile.c_str())\' != \'true\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test.cpp"
                      ,0x3bd,"");
  }
  bVar4 = Parser::Parse(&local_f30,local_12a8._M_dataplus._M_p,(char **)0x0,(char *)0x0);
  TestEq<bool,bool>(bVar4,true,"\'parserOrg.Parse(jsonfile.c_str())\' != \'true\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test.cpp"
                    ,0x3bf,"");
  this = &local_f30.builder_;
  local_1240._0_8_ = FlatBufferBuilderImpl<false>::GetBufferPointer(this);
  local_1240._8_8_ = ZEXT48(local_f30.builder_.buf_.size_);
  local_1240._16_4_ = 0x40;
  local_1240._20_4_ = 1000000;
  local_1228._0_1_ = true;
  local_1228._1_1_ = true;
  local_1220 = 0x7fffffff;
  local_1218._M_local_buf[0] = '\0';
  local_1218._8_8_ = 0;
  _Stack_1208._M_p = (pointer)0x0;
  local_1200 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
  if ((ulong)local_1240._8_8_ < 0x7fffffff) {
    bVar4 = VerifierTemplate<false>::VerifyBufferFromStart<MyGame::Example::ArrayTable>
                      ((VerifierTemplate<false> *)local_1240,"ARRT",0);
    TestEq<bool,bool>(bVar4,true,"\'VerifyArrayTableBuffer(verifierOrg)\' != \'true\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test.cpp"
                      ,0x3c4,"");
    local_12c8._M_string_length = 0;
    local_12c8.field_2._M_local_buf[0] = '\0';
    local_12c8._M_dataplus._M_p = (pointer)&local_12c8.field_2;
    puVar6 = FlatBufferBuilderImpl<false>::GetBufferPointer(this);
    pcVar7 = GenText(&local_f30,puVar6,&local_12c8);
    TestEq<bool,bool>(true,pcVar7 == (char *)0x0,
                      "\'nullptr\' != \'GenText(parserOrg, parserOrg.builder_.GetBufferPointer(), &jsonGen)\'"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test.cpp"
                      ,0x3c9,"");
    bVar4 = Parser::Parse(&local_7b0,local_12c8._M_dataplus._M_p,(char **)0x0,(char *)0x0);
    TestEq<bool,bool>(bVar4,true,"\'parserGen.Parse(jsonGen.c_str())\' != \'true\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test.cpp"
                      ,0x3cc,"");
    local_1288.buf_ = FlatBufferBuilderImpl<false>::GetBufferPointer(&local_7b0.builder_);
    local_1288.size_ = (size_t)local_7b0.builder_.buf_.size_;
    local_1288.opts_.max_depth = 0x40;
    local_1288.opts_.max_tables = 1000000;
    local_1288.opts_.check_alignment = true;
    local_1288.opts_.check_nested_flatbuffers = true;
    local_1288.opts_.max_size = 0x7fffffff;
    local_1288.opts_.assert = false;
    local_1288.upper_bound_ = 0;
    local_1288.depth_ = 0;
    local_1288.num_tables_ = 0;
    local_1288.flex_reuse_tracker_ = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
    if (local_1288.size_ < 0x7fffffff) {
      bVar4 = VerifierTemplate<false>::VerifyBufferFromStart<MyGame::Example::ArrayTable>
                        (&local_1288,"ARRT",0);
      TestEq<bool,bool>(bVar4,true,"\'VerifyArrayTableBuffer(verifierGen)\' != \'true\'",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test.cpp"
                        ,0x3d1,"");
      TestEq<unsigned_int,unsigned_int>
                (local_f30.builder_.buf_.size_,local_7b0.builder_.buf_.size_,
                 "\'parserOrg.builder_.GetSize()\' != \'parserGen.builder_.GetSize()\'",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test.cpp"
                 ,0x3d4,"");
      puVar6 = FlatBufferBuilderImpl<false>::GetBufferPointer(this);
      __s2 = FlatBufferBuilderImpl<false>::GetBufferPointer(&local_7b0.builder_);
      expval = memcmp(puVar6,__s2,(ulong)local_f30.builder_.buf_.size_);
      TestEq<int,int>(expval,0,
                      "\'std::memcmp(parserOrg.builder_.GetBufferPointer(), parserGen.builder_.GetBufferPointer(), parserOrg.builder_.GetSize())\' != \'0\'"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test.cpp"
                      ,0x3d8,"");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_12c8._M_dataplus._M_p != &local_12c8.field_2) {
        operator_delete(local_12c8._M_dataplus._M_p,
                        CONCAT71(local_12c8.field_2._M_allocated_capacity._1_7_,
                                 local_12c8.field_2._M_local_buf[0]) + 1);
      }
      Parser::~Parser(&local_7b0);
      Parser::~Parser(&local_f30);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_12a8._M_dataplus._M_p != &local_12a8.field_2) {
        operator_delete(local_12a8._M_dataplus._M_p,
                        CONCAT71(local_12a8.field_2._M_allocated_capacity._1_7_,
                                 local_12a8.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_12e8._M_dataplus._M_p != &local_12e8.field_2) {
        operator_delete(local_12e8._M_dataplus._M_p,
                        CONCAT71(local_12e8.field_2._M_allocated_capacity._1_7_,
                                 local_12e8.field_2._M_local_buf[0]) + 1);
      }
      return;
    }
  }
LAB_0019a51a:
  __assert_fail("size_ < opts.max_size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/verifier.h"
                ,0x2f,
                "flatbuffers::VerifierTemplate<false>::VerifierTemplate(const uint8_t *const, const size_t, const Options &) [TrackVerifierBufferSize = false]"
               );
}

Assistant:

void FixedLengthArrayJsonTest(const std::string &tests_data_path, bool binary) {
  // load FlatBuffer schema (.fbs) and JSON from disk
  std::string schemafile;
  std::string jsonfile;
  TEST_EQ(flatbuffers::LoadFile(
              (tests_data_path + "arrays_test." + (binary ? "bfbs" : "fbs"))
                  .c_str(),
              binary, &schemafile),
          true);
  TEST_EQ(
      flatbuffers::LoadFile((tests_data_path + "arrays_test.golden").c_str(),
                            false, &jsonfile),
      true);

  // parse schema first, so we can use it to parse the data after
  flatbuffers::Parser parserOrg, parserGen;
  if (binary) {
    flatbuffers::Verifier verifier(
        reinterpret_cast<const uint8_t *>(schemafile.c_str()),
        schemafile.size());
    TEST_EQ(reflection::VerifySchemaBuffer(verifier), true);
    TEST_EQ(parserOrg.Deserialize(
                reinterpret_cast<const uint8_t *>(schemafile.c_str()),
                schemafile.size()),
            true);
    TEST_EQ(parserGen.Deserialize(
                reinterpret_cast<const uint8_t *>(schemafile.c_str()),
                schemafile.size()),
            true);
  } else {
    TEST_EQ(parserOrg.Parse(schemafile.c_str()), true);
    TEST_EQ(parserGen.Parse(schemafile.c_str()), true);
  }
  TEST_EQ(parserOrg.Parse(jsonfile.c_str()), true);

  // First, verify it, just in case:
  flatbuffers::Verifier verifierOrg(parserOrg.builder_.GetBufferPointer(),
                                    parserOrg.builder_.GetSize());
  TEST_EQ(VerifyArrayTableBuffer(verifierOrg), true);

  // Export to JSON
  std::string jsonGen;
  TEST_NULL(
      GenText(parserOrg, parserOrg.builder_.GetBufferPointer(), &jsonGen));

  // Import from JSON
  TEST_EQ(parserGen.Parse(jsonGen.c_str()), true);

  // Verify buffer from generated JSON
  flatbuffers::Verifier verifierGen(parserGen.builder_.GetBufferPointer(),
                                    parserGen.builder_.GetSize());
  TEST_EQ(VerifyArrayTableBuffer(verifierGen), true);

  // Compare generated buffer to original
  TEST_EQ(parserOrg.builder_.GetSize(), parserGen.builder_.GetSize());
  TEST_EQ(std::memcmp(parserOrg.builder_.GetBufferPointer(),
                      parserGen.builder_.GetBufferPointer(),
                      parserOrg.builder_.GetSize()),
          0);
}